

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                     ImGuiWindowClass *window_class)

{
  bool bVar1;
  ImGuiID IVar2;
  undefined8 *in_RCX;
  uint in_EDX;
  uint in_EDI;
  float fVar3;
  ImGuiDockNode *unaff_retaddr;
  ImGuiWindow *host_window;
  char title [256];
  ImGuiWindowFlags window_flags;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiDockNode *node;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiContext *ctx;
  ImGuiWindowFlags in_stack_000002c4;
  bool *in_stack_000002c8;
  char *in_stack_000002d0;
  ImVec2 *in_stack_fffffffffffffe78;
  ImVec2 *pos;
  ImGuiContext *in_stack_fffffffffffffe80;
  int count;
  ImGuiWindow *pIVar4;
  char local_178 [8];
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffea0;
  ImGuiStyleVar in_stack_fffffffffffffea4;
  ImGuiID in_stack_fffffffffffffeac;
  ImU32 in_stack_fffffffffffffeb0;
  ImGuiCol in_stack_fffffffffffffeb4;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImGuiWindowClass local_54;
  ImGuiDockNode *local_40;
  ImGuiWindow *local_38;
  ImGuiContext *local_30;
  ImGuiContext *local_28;
  undefined8 *local_20;
  uint local_14;
  uint local_4;
  
  local_28 = GImGui;
  local_30 = GImGui;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_4 = in_EDI;
  local_38 = GetCurrentWindow();
  if (((local_30->IO).ConfigFlags & 0x40U) != 0) {
    if ((local_38->SkipItems & 1U) != 0) {
      local_14 = local_14 | 1;
    }
    local_40 = DockContextFindNodeByID
                         (in_stack_fffffffffffffe80,
                          (ImGuiID)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    count = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    if (local_40 == (ImGuiDockNode *)0x0) {
      local_40 = DockContextAddNode((ImGuiContext *)
                                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                    in_stack_fffffffffffffeac);
      local_40->LocalFlags = local_40->LocalFlags | 0x800;
    }
    local_40->SharedFlags = local_14;
    if (local_20 == (undefined8 *)0x0) {
      ImGuiWindowClass::ImGuiWindowClass(&local_54);
    }
    else {
      local_54._0_8_ = *local_20;
      local_54._8_8_ = local_20[1];
      local_54._16_2_ = *(undefined2 *)(local_20 + 2);
    }
    (local_40->WindowClass).ClassId = local_54.ClassId;
    (local_40->WindowClass).ParentViewportId = local_54.ParentViewportId;
    (local_40->WindowClass).ViewportFlagsOverrideSet = local_54.ViewportFlagsOverrideSet;
    (local_40->WindowClass).ViewportFlagsOverrideClear = local_54.ViewportFlagsOverrideClear;
    (local_40->WindowClass).DockingAlwaysTabBar = local_54.DockingAlwaysTabBar;
    (local_40->WindowClass).DockingAllowUnclassed = local_54.DockingAllowUnclassed;
    if ((local_40->LastFrameActive == local_30->FrameCount) && ((local_14 & 1) == 0)) {
      local_40->LocalFlags = local_40->LocalFlags | 0x400;
    }
    else {
      local_40->LocalFlags = local_40->LocalFlags | 0x400;
      if ((local_14 & 1) == 0) {
        local_5c = GetContentRegionAvail();
        local_64 = ImFloor(in_stack_fffffffffffffe78);
        if (local_64.x <= 0.0) {
          fVar3 = ImMax<float>(local_5c.x + local_64.x,4.0);
          local_64.x = fVar3;
        }
        if (local_64.y <= 0.0) {
          fVar3 = ImMax<float>(local_5c.y + local_64.y,4.0);
          local_64.y = fVar3;
        }
        local_40->Pos = (local_38->DC).CursorPos;
        local_40->SizeRef = local_64;
        local_40->Size = local_40->SizeRef;
        pos = &local_40->Pos;
        ImVec2::ImVec2(&local_6c,0.0,0.0);
        SetNextWindowPos(pos,0,&local_6c);
        SetNextWindowSize(&local_40->Size,0);
        (local_30->NextWindowData).PosUndock = false;
        ImFormatString(local_178,0x100,"%s/DockSpace_%08X",local_38->Name,(ulong)local_4);
        if ((0 < (local_40->Windows).Size) || (bVar1 = ImGuiDockNode::IsSplitNode(local_40), bVar1))
        {
          PushStyleColor(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
        }
        PushStyleVar(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
        Begin(in_stack_000002d0,in_stack_000002c8,in_stack_000002c4);
        PopStyleVar(in_stack_fffffffffffffe94);
        if ((0 < (local_40->Windows).Size) || (bVar1 = ImGuiDockNode::IsSplitNode(local_40), bVar1))
        {
          PopStyleColor(count);
        }
        pIVar4 = local_30->CurrentWindow;
        pIVar4->DockNodeAsHost = local_40;
        IVar2 = ImGuiWindow::GetID((ImGuiWindow *)
                                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                   in_stack_fffffffffffffe98,
                                   (char *)CONCAT44(in_stack_fffffffffffffe94,
                                                    in_stack_fffffffffffffe90));
        pIVar4->ChildId = IVar2;
        local_40->HostWindow = pIVar4;
        local_40->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        DockNodeUpdate(unaff_retaddr);
        local_30->WithinEndChild = true;
        End();
        local_30->WithinEndChild = false;
      }
      else {
        local_40->LastFrameAlive = local_30->FrameCount;
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;
        return;
    }
    node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK Why do we need a child window to host a dockspace, could we host it in the existing window?
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    if (node->Windows.Size > 0 || node->IsSplitNode())
        PushStyleColor(ImGuiCol_ChildBg, IM_COL32(0, 0, 0, 0));
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PopStyleColor();

    ImGuiWindow* host_window = g.CurrentWindow;
    host_window->DockNodeAsHost = node;
    host_window->ChildId = window->GetID(title);
    node->HostWindow = host_window;
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());
    DockNodeUpdate(node);

    g.WithinEndChild = true;
    End();
    g.WithinEndChild = false;
}